

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O1

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator::
findNextLeaf(FastGeneralizationsIterator *this)

{
  void **ppvVar1;
  int *piVar2;
  NodeAlgorithm **ppNVar3;
  uint **ppuVar4;
  void ***pppvVar5;
  ArrayMapEntry<Kernel::TermList> *pAVar6;
  void **ppvVar7;
  void **ppvVar8;
  long lVar9;
  bool separate;
  int iVar10;
  uint *puVar11;
  uint uVar12;
  uint uVar13;
  Node *pNVar14;
  byte unaff_BPL;
  long *plVar15;
  bool bVar16;
  Node *curr;
  Node *local_50;
  LDIterator *local_48;
  Stack<void_*> *local_40;
  VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> local_38;
  
  if (this->_inLeaf == true) {
    if ((this->_alternatives)._cursor == (this->_alternatives)._stack) {
LAB_0031936e:
      unaff_BPL = 0;
      goto LAB_00319370;
    }
    puVar11 = (this->_subst)._boundVars._cursor;
    uVar12 = puVar11[-1];
    puVar11 = puVar11 + -1;
    if (uVar12 != 0xffffffff) {
      pAVar6 = (this->_subst)._bindings.super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array;
      do {
        pAVar6[uVar12]._timestamp = 0;
        uVar12 = puVar11[-1];
        puVar11 = puVar11 + -1;
      } while (uVar12 != 0xffffffff);
    }
    (this->_subst)._boundVars._cursor = puVar11;
    this->_inLeaf = false;
    local_50 = (Node *)0x0;
    separate = false;
  }
  else {
    local_50 = this->_root;
    if (local_50 == (Node *)0x0) goto LAB_0031936e;
    this->_root = (Node *)0x0;
    separate = enterNode(this,&local_50);
  }
  local_40 = &this->_alternatives;
  local_48 = &this->_ldIterator;
  do {
    if (local_50 == (Node *)0x0) {
      uVar12 = 0;
    }
    else {
      if (separate == false) {
        puVar11 = (this->_specVarNumbers)._cursor + -1;
        (this->_specVarNumbers)._cursor = puVar11;
      }
      else {
        puVar11 = (this->_specVarNumbers)._cursor + -1;
      }
      uVar12 = *puVar11;
    }
    do {
      if (local_50 != (Node *)0x0) break;
      ppvVar7 = (this->_alternatives)._stack;
      ppvVar8 = (this->_alternatives)._cursor;
      if (ppvVar8 == ppvVar7) break;
      ppvVar1 = ppvVar8 + -1;
      (this->_alternatives)._cursor = ppvVar1;
      plVar15 = (long *)ppvVar8[-1];
      if (plVar15 == (long *)0x0) {
        ppNVar3 = &(this->_nodeTypes)._cursor;
        *ppNVar3 = *ppNVar3 + -1;
        ppuVar4 = &(this->_specVarNumbers)._cursor;
        *ppuVar4 = *ppuVar4 + -1;
        if (ppvVar1 != ppvVar7) {
          puVar11 = (this->_subst)._boundVars._cursor;
          uVar13 = puVar11[-1];
          puVar11 = puVar11 + -1;
          if (uVar13 != 0xffffffff) {
            pAVar6 = (this->_subst)._bindings.super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>.
                     _array;
            do {
              pAVar6[uVar13]._timestamp = 0;
              uVar13 = puVar11[-1];
              puVar11 = puVar11 + -1;
            } while (uVar13 != 0xffffffff);
          }
          (this->_subst)._boundVars._cursor = puVar11;
        }
        bVar16 = false;
      }
      else {
        pNVar14 = (Node *)*plVar15;
        if ((this->_nodeTypes)._cursor[-1] == UNSORTED_LIST) {
          while ((pNVar14 != (Node *)0x0 && (((pNVar14->_term)._content & 1) == 0))) {
            pNVar14 = (Node *)plVar15[1];
            plVar15 = plVar15 + 1;
          }
          do {
            lVar9 = plVar15[1];
            local_50 = pNVar14;
            if (lVar9 == 0) goto LAB_0031910a;
            plVar15 = plVar15 + 1;
          } while ((*(byte *)(lVar9 + 8) & 1) == 0);
          if (lVar9 == 0) {
LAB_0031910a:
            separate = false;
          }
          else {
LAB_003190e0:
            if (ppvVar1 == (this->_alternatives)._end) {
              ::Lib::Stack<void_*>::expand(local_40);
            }
            *(this->_alternatives)._cursor = plVar15;
            pppvVar5 = &(this->_alternatives)._cursor;
            *pppvVar5 = *pppvVar5 + 1;
            separate = true;
          }
        }
        else if (((pNVar14->_term)._content & 1) != 0) {
          plVar15 = (long *)plVar15[1];
          local_50 = pNVar14;
          if ((plVar15 == (long *)0x0) || ((*(byte *)(*plVar15 + 8) & 1) == 0)) goto LAB_0031910a;
          goto LAB_003190e0;
        }
        if (separate == false) {
          ppNVar3 = &(this->_nodeTypes)._cursor;
          *ppNVar3 = *ppNVar3 + -1;
          puVar11 = (this->_specVarNumbers)._cursor + -1;
          (this->_specVarNumbers)._cursor = puVar11;
        }
        else {
          puVar11 = (this->_specVarNumbers)._cursor + -1;
        }
        uVar12 = *puVar11;
        bVar16 = local_50 != (Node *)0x0;
      }
    } while (!bVar16);
    if (local_50 == (Node *)0x0) {
      unaff_BPL = 0;
      uVar12 = 1;
    }
    else {
      bVar16 = SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::matchNext
                         (&this->_subst,uVar12,(TermList)(local_50->_term)._content,separate);
      if (bVar16) {
        do {
          iVar10 = (*local_50->_vptr_Node[2])();
          if ((((char)iVar10 != '\0') || (iVar10 = (*local_50->_vptr_Node[5])(), iVar10 != 1)) ||
             (*(int *)((long)&local_50[1]._vptr_Node + 4) != 1)) {
            iVar10 = (*local_50->_vptr_Node[2])();
            if ((char)iVar10 == '\0') {
              separate = enterNode(this,&local_50);
              uVar12 = 0;
              if ((local_50 == (Node *)0x0) &&
                 ((this->_alternatives)._cursor != (this->_alternatives)._stack)) {
                puVar11 = (this->_subst)._boundVars._cursor;
                uVar12 = puVar11[-1];
                puVar11 = puVar11 + -1;
                uVar13 = 0;
                if (uVar12 != 0xffffffff) {
                  pAVar6 = (this->_subst)._bindings.
                           super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array;
                  do {
                    pAVar6[uVar12]._timestamp = 0;
                    uVar12 = puVar11[-1];
                    puVar11 = puVar11 + -1;
                    uVar13 = 0;
                  } while (uVar12 != 0xffffffff);
                }
                goto LAB_00319353;
              }
            }
            else {
              (*local_50->_vptr_Node[8])(&local_38);
              ::Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::operator=
                        (local_48,&local_38);
              if (local_38._core != (IteratorCore<Inferences::ALASCA::Demodulation::Rhs_*> *)0x0) {
                piVar2 = &(local_38._core)->_refCnt;
                *piVar2 = *piVar2 + -1;
                if (*piVar2 == 0) {
                  (*(local_38._core)->_vptr_IteratorCore[1])();
                }
              }
              this->_inLeaf = true;
              unaff_BPL = 1;
              uVar12 = 1;
            }
            break;
          }
          pNVar14 = local_50 + 1;
          local_50 = (Node *)local_50[1]._term._content;
          uVar12 = 0;
          bVar16 = SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::matchNextAux
                             (&this->_subst,
                              (TermList)
                              (this->_subst)._specVars._array[*(uint *)&pNVar14->_vptr_Node].
                              _content,(TermList)(local_50->_term)._content,false);
          if (!bVar16) {
            if ((separate != false) ||
               ((this->_alternatives)._cursor != (this->_alternatives)._stack)) {
              puVar11 = (this->_subst)._boundVars._cursor;
              uVar12 = puVar11[-1];
              puVar11 = puVar11 + -1;
              if (uVar12 != 0xffffffff) {
                pAVar6 = (this->_subst)._bindings.
                         super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array;
                do {
                  pAVar6[uVar12]._timestamp = 0;
                  uVar12 = puVar11[-1];
                  puVar11 = puVar11 + -1;
                } while (uVar12 != 0xffffffff);
              }
              (this->_subst)._boundVars._cursor = puVar11;
            }
            local_50 = (Node *)0x0;
            uVar12 = 4;
          }
        } while (bVar16);
      }
      else {
        local_50 = (Node *)0x0;
        uVar13 = 3;
        uVar12 = 3;
        if ((separate == false) && ((this->_alternatives)._cursor != (this->_alternatives)._stack))
        {
          puVar11 = (this->_subst)._boundVars._cursor;
          uVar12 = puVar11[-1];
          puVar11 = puVar11 + -1;
          if (uVar12 != 0xffffffff) {
            pAVar6 = (this->_subst)._bindings.super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>.
                     _array;
            do {
              pAVar6[uVar12]._timestamp = 0;
              uVar12 = puVar11[-1];
              puVar11 = puVar11 + -1;
            } while (uVar12 != 0xffffffff);
          }
LAB_00319353:
          (this->_subst)._boundVars._cursor = puVar11;
          uVar12 = uVar13;
        }
      }
    }
  } while ((uVar12 < 5) && ((0x19U >> uVar12 & 1) != 0));
LAB_00319370:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool SubstitutionTree<LeafData_>::FastGeneralizationsIterator::findNextLeaf()
{
  Node* curr;
  bool sibilingsRemain = false;
  if(_inLeaf) {
    if(_alternatives.isEmpty()) {
      return false;
    }
    _subst.backtrack();
    _inLeaf=false;
    curr=0;
  } else {
    if(!_root) {
      //If we aren't in a leaf and the findNextLeaf method has already been called,
      //it means that we're out of leafs.
      return false;
    }
    curr=_root;
    _root=0;
    sibilingsRemain=enterNode(curr);
  }
  for(;;) {
main_loop_start:
    unsigned currSpecVar = 0;

    if(curr) {
      if(sibilingsRemain) {
	ASS(_nodeTypes.top()!=UNSORTED_LIST || *static_cast<Node**>(_alternatives.top()));
	currSpecVar=_specVarNumbers.top();
      } else {
	currSpecVar=_specVarNumbers.pop();
      }
    }
    //let's find a node we haven't been to...
    while(curr==0 && _alternatives.isNonEmpty()) {
      void* currAlt=_alternatives.pop();
      if(!currAlt) {
	//there's no alternative at this level, we have to backtrack
	_nodeTypes.pop();
	_specVarNumbers.pop();
	if(_alternatives.isNonEmpty()) {
	  _subst.backtrack();
	}
	continue;
      }

      NodeAlgorithm parentType=_nodeTypes.top();

      //proper term nodes that we want to enter don't appear
      //on _alternatives stack (as we always enter them first)
      if(parentType==UNSORTED_LIST) {
	Node** alts=static_cast<Node**>(currAlt);
	while(*alts && !(*alts)->term().isVar()) {
	  alts++;
	}
	curr=*(alts++);
	while(*alts && !(*alts)->term().isVar()) {
	  alts++;
	}
	if(*alts) {
	  _alternatives.push(alts);
	  sibilingsRemain=true;
	} else {
	  sibilingsRemain=false;
	}
      } else {
	ASS_EQ(parentType,SKIP_LIST)
	auto alts = static_cast<typename SListIntermediateNode::NodeSkipList::Node *>(currAlt);
	if(alts->head()->term().isVar()) {
	  curr=alts->head();
	  if(alts->tail() && alts->tail()->head()->term().isVar()) {
	    _alternatives.push(alts->tail());
	    sibilingsRemain=true;
	  } else {
	    sibilingsRemain=false;
	  }
	}
      }

      if(sibilingsRemain) {
	currSpecVar=_specVarNumbers.top();
      } else {
	_nodeTypes.pop();
	currSpecVar=_specVarNumbers.pop();
      }
      if(curr) {
	break;
      }
    }
    if(!curr) {
      //there are no other alternatives
      return false;
    }
    if(!_subst.matchNext(currSpecVar, curr->term(), sibilingsRemain)) {	//[1]
      //match unsuccessful, try next alternative
      curr=0;
      if(!sibilingsRemain && _alternatives.isNonEmpty()) {
        _subst.backtrack();
      }
      continue;
    }
    while(!curr->isLeaf() && curr->algorithm()==UNSORTED_LIST && static_cast<UArrIntermediateNode*>(curr)->_size==1) {
      //a node with only one child, we don't need to bother with backtracking here.
      unsigned specVar=static_cast<UArrIntermediateNode*>(curr)->childVar;
      curr=static_cast<UArrIntermediateNode*>(curr)->_nodes[0];
      ASS(curr);
      if(!_subst.matchNext(specVar, curr->term(), false)) {
	//matching failed, let's go back to the node, that had multiple children
	//_subst->backtrack();
	if(sibilingsRemain || _alternatives.isNonEmpty()) {
	  //this backtrack can happen for two different reasons and have two different meanings:
	  //either matching at [1] was separated from the previous one and we're backtracking it,
	  //or it was not, which means it had no sibilings and we're backtracking from its parent.
	  _subst.backtrack();
	}
        curr=0;
        goto main_loop_start;
      }
    }
    if(curr->isLeaf()) {
      //we've found a leaf
      _ldIterator=static_cast<Leaf*>(curr)->allChildren();
      _inLeaf=true;
      return true;
    }

    //let's go to the first child
    sibilingsRemain=enterNode(curr);
    if(curr==0 && _alternatives.isNonEmpty()) {
      _subst.backtrack();
    }
  }
}